

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_yundun_get_ddos_config_options.cc
# Opt level: O2

int __thiscall
aliyun::Yundun::GetDdosConfigOptions
          (Yundun *this,YundunGetDdosConfigOptionsResponseType *response,YundunErrorInfo *error_info
          )

{
  vector<aliyun::YundunGetDdosConfigOptionsConnectionThresholdOptionType,_std::allocator<aliyun::YundunGetDdosConfigOptionsConnectionThresholdOptionType>_>
  *this_00;
  bool bVar1;
  int iVar2;
  ArrayIndex AVar3;
  Int IVar4;
  AliRpcRequest *this_01;
  Value *pVVar5;
  Value *pVVar6;
  Value *this_02;
  vector<aliyun::YundunGetDdosConfigOptionsRequestThresholdOptionType,_std::allocator<aliyun::YundunGetDdosConfigOptionsRequestThresholdOptionType>_>
  *vec;
  vector<aliyun::YundunGetDdosConfigOptionsRequestThresholdOptionType,_std::allocator<aliyun::YundunGetDdosConfigOptionsRequestThresholdOptionType>_>
  *vec_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *vec_01;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *vec_02;
  int i;
  uint index;
  char *pcVar7;
  allocator<char> local_2e9;
  Value val;
  allocator<char> local_2cb;
  allocator<char> local_2ca;
  allocator<char> local_2c9;
  YundunGetDdosConfigOptionsResponseType *local_2c8;
  string local_2c0;
  string str_response;
  string local_280;
  string local_260;
  string local_240;
  string local_220;
  string local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  string local_1c0;
  string local_1a0;
  string local_180;
  string secheme;
  Reader reader;
  
  str_response._M_dataplus._M_p = (pointer)&str_response.field_2;
  str_response._M_string_length = 0;
  str_response.field_2._M_local_buf[0] = '\0';
  pcVar7 = "http";
  if (this->use_tls_ != false) {
    pcVar7 = "https";
  }
  local_2c8 = response;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&secheme,pcVar7,(allocator<char> *)&reader);
  this_01 = (AliRpcRequest *)operator_new(0x2c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_180,this->version_,(allocator<char> *)&local_2c0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a0,this->appid_,(allocator<char> *)&val);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c0,this->secret_,&local_2e9);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&reader,
                 &secheme,"://");
  std::operator+(&local_1e0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&reader,
                 this->host_);
  AliRpcRequest::AliRpcRequest(this_01,&local_180,&local_1a0,&local_1c0,&local_1e0);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&reader);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::__cxx11::string::~string((string *)&local_180);
  if (((this->use_tls_ == false) && (pcVar7 = this->proxy_host_, pcVar7 != (char *)0x0)) &&
     (*pcVar7 != '\0')) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_200,pcVar7,(allocator<char> *)&reader);
    AliHttpRequest::SetHttpProxy((AliHttpRequest *)this_01,&local_200);
    std::__cxx11::string::~string((string *)&local_200);
  }
  Json::Value::Value(&val,nullValue);
  Json::Reader::Reader(&reader);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_220,"Action",(allocator<char> *)&local_2c0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_240,"GetDdosConfigOptions",&local_2e9);
  AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_01,&local_220,&local_240);
  std::__cxx11::string::~string((string *)&local_240);
  std::__cxx11::string::~string((string *)&local_220);
  if ((this->region_id_ != (char *)0x0) && (*this->region_id_ != '\0')) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_260,"RegionId",(allocator<char> *)&local_2c0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_280,this->region_id_,&local_2e9);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_01,&local_260,&local_280);
    std::__cxx11::string::~string((string *)&local_280);
    std::__cxx11::string::~string((string *)&local_260);
  }
  iVar2 = (**(this_01->super_AliHttpRequest)._vptr_AliHttpRequest)(this_01);
  if (iVar2 == 0) {
    iVar2 = AliHttpRequest::WaitResponseHeaderComplete((AliHttpRequest *)this_01);
    AliHttpRequest::ReadResponseBody((AliHttpRequest *)this_01,&str_response);
    if (((0 < iVar2) && (str_response._M_string_length != 0)) &&
       (bVar1 = Json::Reader::parse(&reader,&str_response,&val,true), bVar1)) {
      if (error_info != (YundunErrorInfo *)0x0 && iVar2 != 200) {
        bVar1 = Json::Value::isMember(&val,"RequestId");
        if (bVar1) {
          pVVar5 = Json::Value::operator[](&val,"RequestId");
          Json::Value::asString_abi_cxx11_(&local_2c0,pVVar5);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_2c0,anon_var_dwarf_12f544 + 9,&local_2e9);
        }
        std::__cxx11::string::operator=((string *)error_info,(string *)&local_2c0);
        std::__cxx11::string::~string((string *)&local_2c0);
        bVar1 = Json::Value::isMember(&val,"Code");
        if (bVar1) {
          pVVar5 = Json::Value::operator[](&val,"Code");
          Json::Value::asString_abi_cxx11_(&local_2c0,pVVar5);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_2c0,anon_var_dwarf_12f544 + 9,&local_2c9);
        }
        std::__cxx11::string::operator=((string *)&error_info->code,(string *)&local_2c0);
        std::__cxx11::string::~string((string *)&local_2c0);
        bVar1 = Json::Value::isMember(&val,"HostId");
        if (bVar1) {
          pVVar5 = Json::Value::operator[](&val,"HostId");
          Json::Value::asString_abi_cxx11_(&local_2c0,pVVar5);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_2c0,anon_var_dwarf_12f544 + 9,&local_2ca);
        }
        std::__cxx11::string::operator=((string *)&error_info->host_id,(string *)&local_2c0);
        std::__cxx11::string::~string((string *)&local_2c0);
        bVar1 = Json::Value::isMember(&val,"Message");
        if (bVar1) {
          pVVar5 = Json::Value::operator[](&val,"Message");
          Json::Value::asString_abi_cxx11_(&local_2c0,pVVar5);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_2c0,anon_var_dwarf_12f544 + 9,&local_2cb);
        }
        std::__cxx11::string::operator=((string *)&error_info->message,(string *)&local_2c0);
        std::__cxx11::string::~string((string *)&local_2c0);
      }
      if (local_2c8 != (YundunGetDdosConfigOptionsResponseType *)0x0 && iVar2 == 200) {
        bVar1 = Json::Value::isMember(&val,"RequestThresholdOptions1");
        if (bVar1) {
          pVVar5 = Json::Value::operator[](&val,"RequestThresholdOptions1");
          bVar1 = Json::Value::isMember(pVVar5,"RequestThresholdOption");
          if (bVar1) {
            pVVar5 = Json::Value::operator[](&val,"RequestThresholdOptions1");
            pVVar5 = Json::Value::operator[](pVVar5,"RequestThresholdOption");
            anon_unknown.dwarf_55b76::
            Json2Array<aliyun::YundunGetDdosConfigOptionsRequestThresholdOptionType>::Json2Array
                      ((Json2Array<aliyun::YundunGetDdosConfigOptionsRequestThresholdOptionType> *)
                       pVVar5,(Value *)local_2c8,vec);
          }
        }
        bVar1 = Json::Value::isMember(&val,"RequestThresholdOptions2");
        if (bVar1) {
          pVVar5 = Json::Value::operator[](&val,"RequestThresholdOptions2");
          bVar1 = Json::Value::isMember(pVVar5,"RequestThresholdOption");
          if (bVar1) {
            pVVar5 = Json::Value::operator[](&val,"RequestThresholdOptions2");
            pVVar5 = Json::Value::operator[](pVVar5,"RequestThresholdOption");
            anon_unknown.dwarf_55b76::
            Json2Array<aliyun::YundunGetDdosConfigOptionsRequestThresholdOptionType>::Json2Array
                      ((Json2Array<aliyun::YundunGetDdosConfigOptionsRequestThresholdOptionType> *)
                       pVVar5,(Value *)&local_2c8->request_threshold_options2,vec_00);
          }
        }
        bVar1 = Json::Value::isMember(&val,"ConnectionThresholdOptions");
        if (bVar1) {
          pVVar5 = Json::Value::operator[](&val,"ConnectionThresholdOptions");
          bVar1 = Json::Value::isMember(pVVar5,"ConnectionThresholdOption");
          if (bVar1) {
            pVVar5 = Json::Value::operator[](&val,"ConnectionThresholdOptions");
            pVVar5 = Json::Value::operator[](pVVar5,"ConnectionThresholdOption");
            bVar1 = Json::Value::isArray(pVVar5);
            if (bVar1) {
              this_00 = &local_2c8->connection_threshold_options;
              for (index = 0; AVar3 = Json::Value::size(pVVar5), index < AVar3; index = index + 1) {
                pVVar6 = Json::Value::operator[](pVVar5,index);
                bVar1 = Json::Value::isMember(pVVar6,"Sipconn");
                if (bVar1) {
                  this_02 = Json::Value::operator[](pVVar6,"Sipconn");
                  IVar4 = Json::Value::asInt(this_02);
                  local_2c0._M_dataplus._M_p = (pointer)(long)IVar4;
                }
                bVar1 = Json::Value::isMember(pVVar6,"Sipnew");
                if (bVar1) {
                  pVVar6 = Json::Value::operator[](pVVar6,"Sipnew");
                  IVar4 = Json::Value::asInt(pVVar6);
                  local_2c0._M_string_length = (size_type)IVar4;
                }
                std::
                vector<aliyun::YundunGetDdosConfigOptionsConnectionThresholdOptionType,_std::allocator<aliyun::YundunGetDdosConfigOptionsConnectionThresholdOptionType>_>
                ::push_back(this_00,(value_type *)&local_2c0);
              }
            }
          }
        }
        bVar1 = Json::Value::isMember(&val,"QpsOptions1");
        if (bVar1) {
          pVVar5 = Json::Value::operator[](&val,"QpsOptions1");
          bVar1 = Json::Value::isMember(pVVar5,"value");
          if (bVar1) {
            pVVar5 = Json::Value::operator[](&val,"QpsOptions1");
            pVVar5 = Json::Value::operator[](pVVar5,"value");
            anon_unknown.dwarf_55b76::
            Json2Array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::Json2Array((Json2Array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)pVVar5,(Value *)&local_2c8->qps_options1,vec_01);
          }
        }
        bVar1 = Json::Value::isMember(&val,"QpsOptions2");
        iVar2 = 200;
        if (bVar1) {
          pVVar5 = Json::Value::operator[](&val,"QpsOptions2");
          bVar1 = Json::Value::isMember(pVVar5,"value");
          if (bVar1) {
            pVVar5 = Json::Value::operator[](&val,"QpsOptions2");
            pVVar5 = Json::Value::operator[](pVVar5,"value");
            anon_unknown.dwarf_55b76::
            Json2Array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::Json2Array((Json2Array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)pVVar5,(Value *)&local_2c8->qps_options2,vec_02);
          }
        }
      }
      goto LAB_00137446;
    }
  }
  iVar2 = -1;
  if (error_info != (YundunErrorInfo *)0x0) {
    std::__cxx11::string::assign((char *)&error_info->code);
  }
LAB_00137446:
  AliRpcRequest::~AliRpcRequest(this_01);
  operator_delete(this_01,0x2c8);
  Json::Reader::~Reader(&reader);
  Json::Value::~Value(&val);
  std::__cxx11::string::~string((string *)&secheme);
  std::__cxx11::string::~string((string *)&str_response);
  return iVar2;
}

Assistant:

int Yundun::GetDdosConfigOptions(YundunGetDdosConfigOptionsResponseType* response,
                       YundunErrorInfo* error_info) {
  std::string str_response;
  int status_code;
  int ret = 0;
  bool parse_success = false;
  std::string secheme = this->use_tls_ ? "https" : "http";
  AliRpcRequest* req_rpc = new AliRpcRequest(version_,
                         appid_,
                         secret_,
                         secheme + "://" + host_);
  if((!this->use_tls_) && this->proxy_host_ && this->proxy_host_[0]) {
    req_rpc->SetHttpProxy( this->proxy_host_);
  }
  Json::Value val;
  Json::Reader reader;
  req_rpc->AddRequestQuery("Action","GetDdosConfigOptions");
  if(this->region_id_ && this->region_id_[0]) {
    req_rpc->AddRequestQuery("RegionId", this->region_id_);
  }
  if(req_rpc->CommitRequest() != 0) {
     if(error_info) {
       error_info->code = "connect to host failed";
     }
     ret = -1;
     goto out;
  }
  status_code = req_rpc->WaitResponseHeaderComplete();
  req_rpc->ReadResponseBody(str_response);
  if(status_code > 0 && !str_response.empty()){
    parse_success = reader.parse(str_response, val);
  }
  if(!parse_success) {
    if(error_info) {
      error_info->code = "parse response failed";
    }
    ret = -1;
    goto out;
  }
  if(status_code!= 200 && error_info && parse_success) {
    error_info->request_id = val.isMember("RequestId") ? val["RequestId"].asString(): "";
    error_info->code = val.isMember("Code") ? val["Code"].asString(): "";
    error_info->host_id = val.isMember("HostId") ? val["HostId"].asString(): "";
    error_info->message = val.isMember("Message") ? val["Message"].asString(): "";
  }
  if(status_code== 200 && response) {
    Json2Type(val, response);
  }
  ret = status_code;
out:
  delete req_rpc;
  return ret;
}